

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O0

int __thiscall smf::Binasc::outputStyleBoth(Binasc *this,ostream *out,istream *input)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  void *this_00;
  ostream *poVar4;
  byte local_131;
  int local_130;
  int iStack_12c;
  uchar ch;
  int index;
  int currentByte;
  uchar asciiLine [256];
  istream *input_local;
  ostream *out_local;
  Binasc *this_local;
  
  memset(&index,0,0x100);
  iStack_12c = 0;
  local_130 = 0;
  local_131 = std::istream::get();
  while( true ) {
    bVar2 = std::ios::eof();
    if (((bVar2 ^ 0xff) & 1) == 0) break;
    if (local_130 == 0) {
      local_130 = 1;
      index._0_1_ = 0x3b;
      std::operator<<(out,' ');
    }
    iVar1 = local_130;
    if (local_131 < 0x10) {
      std::operator<<(out,'0');
    }
    this_00 = (void *)std::ostream::operator<<(out,std::hex);
    poVar4 = (ostream *)std::ostream::operator<<(this_00,(uint)local_131);
    std::operator<<(poVar4,' ');
    iStack_12c = iStack_12c + 1;
    *(undefined1 *)((long)&index + (long)local_130) = 0x20;
    iVar3 = isprint((uint)local_131);
    if (iVar3 == 0) {
      *(undefined1 *)((long)&index + (long)(local_130 + 1)) = 0x20;
    }
    else {
      *(byte *)((long)&index + (long)(local_130 + 1)) = local_131;
    }
    local_130 = local_130 + 2;
    *(undefined1 *)((long)&index + (long)local_130) = 0x20;
    local_130 = iVar1 + 3;
    if (this->m_maxLineBytes <= iStack_12c) {
      std::operator<<(out,'\n');
      *(undefined1 *)((long)&index + (long)(iVar1 + 3)) = 0;
      poVar4 = std::operator<<(out,(uchar *)&index);
      std::operator<<(poVar4,"\n\n");
      iStack_12c = 0;
      local_130 = 0;
    }
    local_131 = std::istream::get();
  }
  if (iStack_12c != 0) {
    std::operator<<(out,'\n');
    *(undefined1 *)((long)&index + (long)local_130) = 0;
    poVar4 = std::operator<<(out,(uchar *)&index);
    poVar4 = std::operator<<(poVar4,'\n');
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  return 1;
}

Assistant:

int Binasc::outputStyleBoth(std::ostream& out, std::istream& input) {
	uchar asciiLine[256] = {0};    // storage for output line
	int currentByte = 0;           // current byte output in line
	int index = 0;                 // current character in asciiLine
	uchar ch;                      // current input byte

	ch = input.get();
	while (!input.eof()) {
		if (index == 0) {
			asciiLine[index++] = ';';
			out << ' ';
		}
		if (ch < 0x10) {
			out << '0';
		}
		out << std::hex << (int)ch << ' ';
		currentByte++;

		asciiLine[index++] = ' ';
		if (isprint(ch)) {
			asciiLine[index++] = ch;
		} else {
			asciiLine[index++] = ' ';
		}
		asciiLine[index++] = ' ';

		if (currentByte >= m_maxLineBytes) {
			out << '\n';
			asciiLine[index] = '\0';
			out << asciiLine << "\n\n";
			currentByte = 0;
			index = 0;
		}
		ch = input.get();
	}

	if (currentByte != 0) {
		out << '\n';
		asciiLine[index] = '\0';
		out << asciiLine << '\n' << std::endl;
	}

	return 1;
}